

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O1

void __thiscall
gl4cts::GLSL420Pack::BindingImageArrayTest::releaseResource(BindingImageArrayTest *this)

{
  GLuint i;
  long lVar1;
  texture *textures [7];
  texture *local_48 [8];
  
  local_48[0] = &this->m_goku_00_texture;
  local_48[1] = &this->m_goku_01_texture;
  local_48[2] = &this->m_goku_02_texture;
  local_48[3] = &this->m_goku_03_texture;
  local_48[4] = &this->m_goku_04_texture;
  local_48[5] = &this->m_goku_05_texture;
  local_48[6] = &this->m_goku_06_texture;
  lVar1 = 0;
  do {
    Utils::texture::release(local_48[lVar1]);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 7);
  return;
}

Assistant:

void BindingImageArrayTest::releaseResource()
{
	Utils::texture* textures[7] = {
		&m_goku_00_texture, &m_goku_01_texture, &m_goku_02_texture, &m_goku_03_texture,
		&m_goku_04_texture, &m_goku_05_texture, &m_goku_06_texture,
	};

	for (GLuint i = 0; i < 7; ++i)
	{
		textures[i]->release();
	}
}